

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pololu.h
# Opt level: O0

int SetRudderThrustersFluxPololu
              (POLOLU *pPololu,double angle,double urt,double ult,double urf,double ulf)

{
  int iVar1;
  int local_194;
  int local_190;
  int local_18c;
  int local_188;
  int local_184;
  int local_180;
  int local_17c;
  int local_178;
  int local_174;
  int local_170;
  int local_16c;
  int local_168;
  int local_164;
  int local_160;
  int local_15c;
  double local_158;
  double local_148;
  double local_138;
  double local_120;
  double local_118;
  double angletmp;
  int pws [24];
  int selectedchannels [24];
  double ulf_local;
  double urf_local;
  double ult_local;
  double urt_local;
  double angle_local;
  POLOLU *pPololu_local;
  
  memset(pws + 0x16,0,0x60);
  memset(&angletmp,0,0x60);
  if (angle < 0.0) {
    if (ABS(pPololu->MinAngle) <= ABS(pPololu->MaxAngle)) {
      local_138 = pPololu->MaxAngle;
    }
    else {
      local_138 = pPololu->MinAngle;
    }
    local_138 = ABS(local_138);
    local_120 = pPololu->MidAngle + (angle * (pPololu->MidAngle - pPololu->MinAngle)) / local_138;
  }
  else {
    if (ABS(pPololu->MinAngle) <= ABS(pPololu->MaxAngle)) {
      local_118 = pPololu->MaxAngle;
    }
    else {
      local_118 = pPololu->MinAngle;
    }
    local_118 = ABS(local_118);
    local_120 = pPololu->MidAngle + (angle * (pPololu->MaxAngle - pPololu->MidAngle)) / local_118;
  }
  if (local_120 < 0.0) {
    if (ABS(pPololu->MinAngle) <= ABS(pPololu->MaxAngle)) {
      local_158 = pPololu->MaxAngle;
    }
    else {
      local_158 = pPololu->MinAngle;
    }
    local_158 = ABS(local_158);
    pws[(long)pPololu->rudderchan + -2] = (int)((local_120 * 500.0) / local_158) + 0x5dc;
  }
  else {
    if (ABS(pPololu->MinAngle) <= ABS(pPololu->MaxAngle)) {
      local_148 = pPololu->MaxAngle;
    }
    else {
      local_148 = pPololu->MinAngle;
    }
    local_148 = ABS(local_148);
    pws[(long)pPololu->rudderchan + -2] = (int)((local_120 * 500.0) / local_148) + 0x5dc;
  }
  pws[(long)pPololu->rightthrusterchan + -2] = (int)((urt * 1000.0) / 2.0) + 0x5dc;
  pws[(long)pPololu->leftthrusterchan + -2] = (int)((ult * 1000.0) / 2.0) + 0x5dc;
  pws[(long)pPololu->rightfluxchan + -2] = (int)((urf * 1000.0) / 2.0) + 0x5dc;
  pws[(long)pPololu->leftfluxchan + -2] = (int)((ulf * 1000.0) / 2.0) + 0x5dc;
  if (pws[(long)pPololu->rudderchan + -2] < 2000) {
    local_15c = pws[(long)pPololu->rudderchan + -2];
  }
  else {
    local_15c = 2000;
  }
  if (local_15c < 0x3e9) {
    local_164 = 1000;
  }
  else {
    if (pws[(long)pPololu->rudderchan + -2] < 2000) {
      local_160 = pws[(long)pPololu->rudderchan + -2];
    }
    else {
      local_160 = 2000;
    }
    local_164 = local_160;
  }
  pws[(long)pPololu->rudderchan + -2] = local_164;
  if (pws[(long)pPololu->rightthrusterchan + -2] < 2000) {
    local_168 = pws[(long)pPololu->rightthrusterchan + -2];
  }
  else {
    local_168 = 2000;
  }
  if (local_168 < 0x3e9) {
    local_170 = 1000;
  }
  else {
    if (pws[(long)pPololu->rightthrusterchan + -2] < 2000) {
      local_16c = pws[(long)pPololu->rightthrusterchan + -2];
    }
    else {
      local_16c = 2000;
    }
    local_170 = local_16c;
  }
  pws[(long)pPololu->rightthrusterchan + -2] = local_170;
  if (pws[(long)pPololu->leftthrusterchan + -2] < 2000) {
    local_174 = pws[(long)pPololu->leftthrusterchan + -2];
  }
  else {
    local_174 = 2000;
  }
  if (local_174 < 0x3e9) {
    local_17c = 1000;
  }
  else {
    if (pws[(long)pPololu->leftthrusterchan + -2] < 2000) {
      local_178 = pws[(long)pPololu->leftthrusterchan + -2];
    }
    else {
      local_178 = 2000;
    }
    local_17c = local_178;
  }
  pws[(long)pPololu->leftthrusterchan + -2] = local_17c;
  if (pws[(long)pPololu->rightfluxchan + -2] < 2000) {
    local_180 = pws[(long)pPololu->rightfluxchan + -2];
  }
  else {
    local_180 = 2000;
  }
  if (local_180 < 0x3e9) {
    local_188 = 1000;
  }
  else {
    if (pws[(long)pPololu->rightfluxchan + -2] < 2000) {
      local_184 = pws[(long)pPololu->rightfluxchan + -2];
    }
    else {
      local_184 = 2000;
    }
    local_188 = local_184;
  }
  pws[(long)pPololu->rightfluxchan + -2] = local_188;
  if (pws[(long)pPololu->leftfluxchan + -2] < 2000) {
    local_18c = pws[(long)pPololu->leftfluxchan + -2];
  }
  else {
    local_18c = 2000;
  }
  if (local_18c < 0x3e9) {
    local_194 = 1000;
  }
  else {
    if (pws[(long)pPololu->leftfluxchan + -2] < 2000) {
      local_190 = pws[(long)pPololu->leftfluxchan + -2];
    }
    else {
      local_190 = 2000;
    }
    local_194 = local_190;
  }
  pws[(long)pPololu->leftfluxchan + -2] = local_194;
  pws[(long)pPololu->rudderchan + 0x16] = 1;
  pws[(long)pPololu->rightthrusterchan + 0x16] = 1;
  pws[(long)pPololu->leftthrusterchan + 0x16] = 1;
  pws[(long)pPololu->rightfluxchan + 0x16] = 1;
  pws[(long)pPololu->leftfluxchan + 0x16] = 1;
  iVar1 = SetAllPWMsPololu(pPololu,pws + 0x16,(int *)&angletmp);
  return iVar1;
}

Assistant:

inline int SetRudderThrustersFluxPololu(POLOLU* pPololu, double angle, double urt, double ult, double urf, double ulf)
{
	int selectedchannels[NB_CHANNELS_PWM_POLOLU];
	int pws[NB_CHANNELS_PWM_POLOLU];
#ifndef DISABLE_RUDDER_MIDANGLE
	double angletmp = 0;
#endif // DISABLE_RUDDER_MIDANGLE

	memset(selectedchannels, 0, sizeof(selectedchannels));
	memset(pws, 0, sizeof(pws));

	// Convert angle (in rad) into Pololu pulse width (in us).
#ifndef DISABLE_RUDDER_MIDANGLE
	angletmp = angle >= 0? pPololu->MidAngle+angle*(pPololu->MaxAngle-pPololu->MidAngle)/max(fabs(pPololu->MinAngle), fabs(pPololu->MaxAngle)): pPololu->MidAngle+angle*(pPololu->MidAngle-pPololu->MinAngle)/max(fabs(pPololu->MinAngle), fabs(pPololu->MaxAngle));
	//angletmp = angle >= 0? pPololu->MidAngle+urudder*(pPololu->MaxAngle-pPololu->MidAngle): pPololu->MidAngle+urudder*(pPololu->MidAngle-pPololu->MinAngle);
	if (angletmp >= 0)
		pws[pPololu->rudderchan] = DEFAULT_MID_PW_POLOLU+(int)(angletmp*(DEFAULT_MAX_PW_POLOLU-DEFAULT_MID_PW_POLOLU)
			/max(fabs(pPololu->MinAngle), fabs(pPololu->MaxAngle)));
	else
		pws[pPololu->rudderchan] = DEFAULT_MID_PW_POLOLU+(int)(angletmp*(DEFAULT_MID_PW_POLOLU-DEFAULT_MIN_PW_POLOLU)
			/max(fabs(pPololu->MinAngle), fabs(pPololu->MaxAngle)));
#else
	pws[pPololu->rudderchan] = DEFAULT_MID_PW_POLOLU+(int)(angle*(DEFAULT_MAX_PW_POLOLU-DEFAULT_MIN_PW_POLOLU)
		/(pPololu->MaxAngle-pPololu->MinAngle));
#endif // DISABLE_RUDDER_MIDANGLE
	// Convert u (in [-1;1]) into Pololu pulse width (in us).
	pws[pPololu->rightthrusterchan] = DEFAULT_MID_PW_POLOLU+(int)(urt*(DEFAULT_MAX_PW_POLOLU-DEFAULT_MIN_PW_POLOLU)/2.0);
	pws[pPololu->leftthrusterchan] = DEFAULT_MID_PW_POLOLU+(int)(ult*(DEFAULT_MAX_PW_POLOLU-DEFAULT_MIN_PW_POLOLU)/2.0);
	pws[pPololu->rightfluxchan] = DEFAULT_MID_PW_POLOLU+(int)(urf*(DEFAULT_MAX_PW_POLOLU-DEFAULT_MIN_PW_POLOLU)/2.0);
	pws[pPololu->leftfluxchan] = DEFAULT_MID_PW_POLOLU+(int)(ulf*(DEFAULT_MAX_PW_POLOLU-DEFAULT_MIN_PW_POLOLU)/2.0);

	pws[pPololu->rudderchan] = max(min(pws[pPololu->rudderchan], DEFAULT_MAX_PW_POLOLU), DEFAULT_MIN_PW_POLOLU);
	pws[pPololu->rightthrusterchan] = max(min(pws[pPololu->rightthrusterchan], DEFAULT_MAX_PW_POLOLU), DEFAULT_MIN_PW_POLOLU);
	pws[pPololu->leftthrusterchan] = max(min(pws[pPololu->leftthrusterchan], DEFAULT_MAX_PW_POLOLU), DEFAULT_MIN_PW_POLOLU);
	pws[pPololu->rightfluxchan] = max(min(pws[pPololu->rightfluxchan], DEFAULT_MAX_PW_POLOLU), DEFAULT_MIN_PW_POLOLU);
	pws[pPololu->leftfluxchan] = max(min(pws[pPololu->leftfluxchan], DEFAULT_MAX_PW_POLOLU), DEFAULT_MIN_PW_POLOLU);

	selectedchannels[pPololu->rudderchan] = 1;
	selectedchannels[pPololu->rightthrusterchan] = 1;
	selectedchannels[pPololu->leftthrusterchan] = 1;
	selectedchannels[pPololu->rightfluxchan] = 1;
	selectedchannels[pPololu->leftfluxchan] = 1;

	return SetAllPWMsPololu(pPololu, selectedchannels, pws);
}